

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugRenderKeyboardPreview(ImDrawList *draw_list)

{
  bool bVar1;
  ImVec2 label_min;
  ImVec2 face_max;
  ImVec2 face_min;
  ImVec2 key_max;
  ImVec2 key_min;
  KeyLayoutData *key_data;
  int n;
  KeyLayoutData keys_to_display [15];
  ImVec2 start_pos;
  ImVec2 board_max;
  ImVec2 board_min;
  float key_row_offset;
  ImVec2 key_step;
  ImVec2 key_label_pos;
  float key_face_rounding;
  ImVec2 key_face_pos;
  ImVec2 key_face_size;
  float key_rounding;
  ImVec2 key_size;
  float scale;
  ImVec2 *in_stack_fffffffffffffd98;
  ImDrawList *in_stack_fffffffffffffda0;
  ImVec2 *this;
  ImVec2 *this_00;
  ImVec2 *this_01;
  ImDrawList *this_02;
  float fVar2;
  float fVar3;
  ImDrawList *this_03;
  ImVec2 local_228;
  ImVec2 local_220;
  ImVec2 local_218;
  ImVec2 local_210;
  float local_208;
  float local_204;
  ImDrawCmd *local_200;
  int local_1f4;
  ImVec2 local_1f0;
  float local_1e8;
  int iStack_1e4;
  float in_stack_fffffffffffffe20;
  ImDrawFlags in_stack_fffffffffffffe24;
  float in_stack_fffffffffffffe28;
  ImU32 in_stack_fffffffffffffe2c;
  ImDrawListSharedData *in_stack_fffffffffffffe30;
  ImDrawVert *in_stack_fffffffffffffe38;
  ImDrawList *in_stack_fffffffffffffe40;
  ImVec2 local_78;
  undefined1 local_70 [8];
  ImVec2 local_68;
  float local_60;
  ImVec2 local_5c;
  undefined1 local_54 [8];
  ImVec2 local_4c;
  float local_44;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  float local_20;
  ImVec2 local_1c;
  ImVec2 local_14;
  float local_c;
  
  local_c = GetFontSize();
  local_c = local_c / 13.0;
  this = &local_1c;
  ImVec2::ImVec2(this,35.0,35.0);
  local_14 = ::operator*(in_stack_fffffffffffffd98,0.0);
  fVar2 = 3.0;
  local_20 = local_c * 3.0;
  this_00 = &local_30;
  ImVec2::ImVec2(this_00,25.0,25.0);
  local_28 = ::operator*(in_stack_fffffffffffffd98,0.0);
  this_01 = &local_40;
  fVar3 = 5.0;
  ImVec2::ImVec2(this_01,5.0,fVar2);
  local_38 = ::operator*(in_stack_fffffffffffffd98,0.0);
  local_44 = local_c + local_c;
  this_02 = (ImDrawList *)local_54;
  ImVec2::ImVec2((ImVec2 *)this_02,7.0,4.0);
  local_4c = ::operator*(in_stack_fffffffffffffd98,0.0);
  ImVec2::ImVec2(&local_5c,local_14.x - 1.0,local_14.y - 1.0);
  local_60 = local_c * 9.0;
  local_68 = GetCursorScreenPos();
  this_03 = (ImDrawList *)local_70;
  ImVec2::ImVec2((ImVec2 *)this_03,local_60 + local_60 + local_5c.x * fVar2 + local_68.x + 10.0,
                 local_5c.y * fVar2 + local_68.y + 10.0);
  ImVec2::ImVec2(&local_78,(local_68.x + fVar3) - local_5c.x,local_68.y);
  memcpy(&local_1e8,&DAT_003038a0,0x168);
  local_1f0 = ::operator-(in_stack_fffffffffffffd98,(ImVec2 *)0x20309e);
  Dummy((ImVec2 *)this_02);
  bVar1 = IsItemVisible();
  if (bVar1) {
    ImDrawList::PushClipRect
              (this_03,(ImVec2 *)CONCAT44(fVar3,fVar2),(ImVec2 *)this_02,
               SUB81((ulong)this_01 >> 0x38,0));
    for (local_1f4 = 0; local_1f4 < 0xf; local_1f4 = local_1f4 + 1) {
      local_200 = (ImDrawCmd *)(&local_1e8 + (long)local_1f4 * 6);
      fVar2 = (float)(int)(local_200->ClipRect).x;
      in_stack_fffffffffffffda0 = (ImDrawList *)&local_208;
      ImVec2::ImVec2((ImVec2 *)in_stack_fffffffffffffda0,
                     fVar2 * local_60 +
                     (float)(&iStack_1e4)[(long)local_1f4 * 6] * local_5c.x + local_78.x,
                     fVar2 * local_5c.y + local_78.y);
      local_210 = ::operator+(in_stack_fffffffffffffd98,(ImVec2 *)0x20317e);
      ImDrawList::AddRectFilled
                (this_02,this_01,this_00,(ImU32)((ulong)this >> 0x20),SUB84(this,0),
                 (ImDrawFlags)((ulong)in_stack_fffffffffffffda0 >> 0x20));
      ImDrawList::AddRect(in_stack_fffffffffffffe40,&in_stack_fffffffffffffe38->pos,
                          &in_stack_fffffffffffffe30->TexUvWhitePixel,in_stack_fffffffffffffe2c,
                          in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                          in_stack_fffffffffffffe20);
      ImVec2::ImVec2(&local_218,local_208 + local_38.x,local_204 + local_38.y);
      ImVec2::ImVec2(&local_220,local_218.x + local_28.x,local_218.y + local_28.y);
      ImDrawList::AddRect(in_stack_fffffffffffffe40,&in_stack_fffffffffffffe38->pos,
                          &in_stack_fffffffffffffe30->TexUvWhitePixel,in_stack_fffffffffffffe2c,
                          in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                          in_stack_fffffffffffffe20);
      ImDrawList::AddRectFilled
                (this_02,this_01,this_00,(ImU32)((ulong)this >> 0x20),SUB84(this,0),
                 (ImDrawFlags)((ulong)in_stack_fffffffffffffda0 >> 0x20));
      ImVec2::ImVec2(&local_228,local_208 + local_4c.x,local_204 + local_4c.y);
      ImDrawList::AddText(this_02,this_01,(ImU32)((ulong)this_00 >> 0x20),(char *)this,
                          (char *)in_stack_fffffffffffffda0);
      bVar1 = IsKeyDown(ImGuiKey_KeysData_OFFSET);
      if (bVar1) {
        ImDrawList::AddRectFilled
                  (this_02,this_01,this_00,(ImU32)((ulong)this >> 0x20),SUB84(this,0),
                   (ImDrawFlags)((ulong)in_stack_fffffffffffffda0 >> 0x20));
      }
    }
    ImDrawList::PopClipRect(in_stack_fffffffffffffda0);
  }
  return;
}

Assistant:

void ImGui::DebugRenderKeyboardPreview(ImDrawList* draw_list)
{
    const float scale = ImGui::GetFontSize() / 13.0f;
    const ImVec2 key_size = ImVec2(35.0f, 35.0f) * scale;
    const float  key_rounding = 3.0f * scale;
    const ImVec2 key_face_size = ImVec2(25.0f, 25.0f) * scale;
    const ImVec2 key_face_pos = ImVec2(5.0f, 3.0f) * scale;
    const float  key_face_rounding = 2.0f * scale;
    const ImVec2 key_label_pos = ImVec2(7.0f, 4.0f) * scale;
    const ImVec2 key_step = ImVec2(key_size.x - 1.0f, key_size.y - 1.0f);
    const float  key_row_offset = 9.0f * scale;

    ImVec2 board_min = GetCursorScreenPos();
    ImVec2 board_max = ImVec2(board_min.x + 3 * key_step.x + 2 * key_row_offset + 10.0f, board_min.y + 3 * key_step.y + 10.0f);
    ImVec2 start_pos = ImVec2(board_min.x + 5.0f - key_step.x, board_min.y);

    struct KeyLayoutData { int Row, Col; const char* Label; ImGuiKey Key; };
    const KeyLayoutData keys_to_display[] =
    {
        { 0, 0, "", ImGuiKey_Tab },      { 0, 1, "Q", ImGuiKey_Q }, { 0, 2, "W", ImGuiKey_W }, { 0, 3, "E", ImGuiKey_E }, { 0, 4, "R", ImGuiKey_R },
        { 1, 0, "", ImGuiKey_CapsLock }, { 1, 1, "A", ImGuiKey_A }, { 1, 2, "S", ImGuiKey_S }, { 1, 3, "D", ImGuiKey_D }, { 1, 4, "F", ImGuiKey_F },
        { 2, 0, "", ImGuiKey_LeftShift },{ 2, 1, "Z", ImGuiKey_Z }, { 2, 2, "X", ImGuiKey_X }, { 2, 3, "C", ImGuiKey_C }, { 2, 4, "V", ImGuiKey_V }
    };

    // Elements rendered manually via ImDrawList API are not clipped automatically.
    // While not strictly necessary, here IsItemVisible() is used to avoid rendering these shapes when they are out of view.
    Dummy(board_max - board_min);
    if (!IsItemVisible())
        return;
    draw_list->PushClipRect(board_min, board_max, true);
    for (int n = 0; n < IM_ARRAYSIZE(keys_to_display); n++)
    {
        const KeyLayoutData* key_data = &keys_to_display[n];
        ImVec2 key_min = ImVec2(start_pos.x + key_data->Col * key_step.x + key_data->Row * key_row_offset, start_pos.y + key_data->Row * key_step.y);
        ImVec2 key_max = key_min + key_size;
        draw_list->AddRectFilled(key_min, key_max, IM_COL32(204, 204, 204, 255), key_rounding);
        draw_list->AddRect(key_min, key_max, IM_COL32(24, 24, 24, 255), key_rounding);
        ImVec2 face_min = ImVec2(key_min.x + key_face_pos.x, key_min.y + key_face_pos.y);
        ImVec2 face_max = ImVec2(face_min.x + key_face_size.x, face_min.y + key_face_size.y);
        draw_list->AddRect(face_min, face_max, IM_COL32(193, 193, 193, 255), key_face_rounding, ImDrawFlags_None, 2.0f);
        draw_list->AddRectFilled(face_min, face_max, IM_COL32(252, 252, 252, 255), key_face_rounding);
        ImVec2 label_min = ImVec2(key_min.x + key_label_pos.x, key_min.y + key_label_pos.y);
        draw_list->AddText(label_min, IM_COL32(64, 64, 64, 255), key_data->Label);
        if (IsKeyDown(key_data->Key))
            draw_list->AddRectFilled(key_min, key_max, IM_COL32(255, 0, 0, 128), key_rounding);
    }
    draw_list->PopClipRect();
}